

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O1

int ztlex_next_token(ztlex_t *lex,ztlextok_t *token,ztlexinf_t **info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ztlextok_t zVar5;
  ushort **ppuVar6;
  long lVar7;
  
  *info = (ztlexinf_t *)0x0;
  iVar4 = 0;
  while( true ) {
    do {
      iVar2 = (*lex->getC)(lex);
      if (iVar2 == -1) {
        return 0;
      }
      ppuVar6 = __ctype_b_loc();
    } while ((*(byte *)((long)*ppuVar6 + (long)iVar2 * 2 + 1) & 0x20) != 0);
    (*lex->ungetC)(iVar2,lex);
    iVar2 = (*lex->getC)(lex);
    if (iVar2 != 0x2f) break;
    iVar3 = (*lex->getC)(lex);
    if (iVar3 != 0x2f) {
      iVar2 = 0x2f;
      if (iVar3 != -1) {
        (*lex->ungetC)(iVar3,lex);
      }
      goto LAB_001035ea;
    }
    do {
      iVar2 = (*lex->getC)(lex);
    } while (iVar2 != 10);
    (*lex->ungetC)(10,lex);
  }
  if (iVar2 == -1) {
    return 0;
  }
LAB_001035ea:
  (*lex->ungetC)(iVar2,lex);
  lVar7 = 8;
  do {
    iVar2 = (**(code **)((long)&ztlex_selftest::cases[0x33].newCursorPos + lVar7))(lex);
    if (iVar2 == -1) {
      bVar1 = false;
      iVar4 = 0;
    }
    else if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      *token = *(ztlextok_t *)((long)&ztlex_next_token::map[0].fn + lVar7);
      iVar4 = lex->column;
      (lex->info).line = lex->line;
      (lex->info).column = iVar4 - iVar2;
      (lex->info).length = iVar2;
      memcpy((lex->info).lexeme,lex->lexeme,(long)(iVar2 + 1));
      *info = &lex->info;
      iVar4 = 1;
      bVar1 = false;
    }
    if (!bVar1) {
      return iVar4;
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x68);
  iVar4 = (*lex->getC)(lex);
  if (iVar4 < 0x5b) {
    switch(iVar4) {
    case 0x28:
      zVar5 = 9;
      break;
    case 0x29:
      zVar5 = 10;
      break;
    case 0x2a:
      zVar5 = 3;
      break;
    case 0x2b:
      zVar5 = 1;
      break;
    case 0x2c:
      zVar5 = 0x13;
      break;
    case 0x2d:
      zVar5 = 2;
      break;
    case 0x2f:
      zVar5 = 4;
      break;
    case 0x3b:
      zVar5 = 6;
      break;
    case 0x3d:
      zVar5 = 5;
      break;
    default:
      if (iVar4 == -1) {
        return 0;
      }
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3c:
switchD_001036c9_caseD_2e:
      ztlex_next_token_cold_1();
      return 0;
    }
  }
  else if (iVar4 < 0x7b) {
    if (iVar4 == 0x5b) {
      zVar5 = 0x11;
    }
    else {
      if (iVar4 != 0x5d) goto switchD_001036c9_caseD_2e;
      zVar5 = 0x12;
    }
  }
  else if (iVar4 == 0x7b) {
    zVar5 = 0xf;
  }
  else {
    if (iVar4 != 0x7d) goto switchD_001036c9_caseD_2e;
    zVar5 = 0x10;
  }
  *token = zVar5;
  iVar4 = lex->column;
  (lex->info).line = lex->line;
  (lex->info).column = iVar4 + -1;
  (lex->info).length = 0;
  *info = &lex->info;
  return 1;
}

Assistant:

int ztlex_next_token(ztlex_t     *lex,
                     ztlextok_t  *token,
               const ztlexinf_t **info)
{
  static const struct
  {
    int        (*fn)(ztlex_t *);
    ztlextok_t token;
  }
  map[] =
  {
    { ztlex_isdollarhex, ZTTOKEN_DOLLARHEX },
    { ztlex_ishex,       ZTTOKEN_HEX       },
    { ztlex_isdecimal,   ZTTOKEN_DECIMAL   },
    { ztlex_isinteger,   ZTTOKEN_INT       },
    { ztlex_isnil,       ZTTOKEN_NIL       },
    { ztlex_isname,      ZTTOKEN_NAME      },
  };

  int c;
  int i;

  assert(lex);
  assert(token);
  assert(info);

  *info = NULL;

again:
  /* absorb all leading whitespace */
  do
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;
  }
  while (isspace(c));

  lex->ungetC(c, lex);

  /* absorb comments */
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;

    if (c != '/')
    {
      lex->ungetC(c, lex);
      goto notcomment;
    }

    c = lex->getC(lex);
    if (c != '/') /* including EOF */
    {
      if (c != EOF)
        lex->ungetC(c, lex);
      lex->ungetC('/', lex);
      goto notcomment;
    }

    /* we've found '//' - absorb the remainder of the line */
    do
      c = lex->getC(lex);
    while (c != '\n');

    if (c != EOF)
      lex->ungetC(c, lex);

    goto again;
  }

notcomment:
  /* try the complex tokens first */
  for (i = 0; i < (int) NELEMS(map); i++)
  {
    int len;

    len = map[i].fn(lex);
    if (len == EOF)
    {
      return 0;
    }
    else if (len)
    {
      *token = map[i].token;

      lex->info.line   = lex->line;
      lex->info.column = lex->column - len; /* report start of token */
      lex->info.length = len;
      memcpy(&lex->info.lexeme[0], lex->lexeme, len + 1);
      *info = &lex->info;
      return 1;
    }
  }

  /* deal with basic tokens */
  c = lex->getC(lex);
  switch (c)
  {
    case '(': *token = ZTTOKEN_LPAREN;    break;
    case ')': *token = ZTTOKEN_RPAREN;    break;
    case '*': *token = ZTTOKEN_TIMES;     break;
    case '+': *token = ZTTOKEN_PLUS;      break;
    case ',': *token = ZTTOKEN_COMMA;     break;
    case '-': *token = ZTTOKEN_MINUS;     break;
    case '/': *token = ZTTOKEN_DIVIDE;    break;
    case ';': *token = ZTTOKEN_SEMICOLON; break;
    case '=': *token = ZTTOKEN_EQUALS;    break;
    case '[': *token = ZTTOKEN_LSQBRA;    break;
    case ']': *token = ZTTOKEN_RSQBRA;    break;
    case '{': *token = ZTTOKEN_LBRACE;    break;
    case '}': *token = ZTTOKEN_RBRACE;    break;
    default:
      if (c != EOF) {
        lex->ungetC(c, lex);
        fprintf(stderr, "Unknown token '%c' at line %d column %d\n", c, lex->line, lex->column);
      }
      return 0;
  }

  lex->info.line   = lex->line;
  lex->info.column = lex->column - 1; /* report start of token */
  lex->info.length = 0; /* FIXME: Should basic tokens have any length? */
  *info = &lex->info;
  return 1;
}